

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::doPossDup(Session *this,Message *msg)

{
  Header *this_00;
  bool bVar1;
  MsgType *pMVar2;
  UtcTimeStampField *this_01;
  bool bVar3;
  string local_c0;
  DateTime local_a0;
  OrigSendingTime origSendingTime;
  
  std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_c0,&this->m_timestamper);
  OrigSendingTime::OrigSendingTime(&origSendingTime,(UTCTIMESTAMP *)&local_c0);
  this_00 = &msg->m_header;
  pMVar2 = FieldMap::getField<FIX::MsgType>(&this_00->super_FieldMap);
  this_01 = &FieldMap::getField<FIX::SendingTime>(&this_00->super_FieldMap)->super_UtcTimeStampField
  ;
  bVar1 = std::operator!=(&(pMVar2->super_StringField).super_FieldBase.m_string,"4");
  bVar3 = true;
  if (bVar1) {
    bVar1 = FieldMap::getFieldIfSet(&this_00->super_FieldMap,(FieldBase *)&origSendingTime);
    if (bVar1) {
      UtcTimeStampField::getValue
                ((UtcTimeStamp *)&local_c0,&origSendingTime.super_UtcTimeStampField);
      UtcTimeStampField::getValue((UtcTimeStamp *)&local_a0,this_01);
      bVar1 = operator>((DateTime *)&local_c0,&local_a0);
      if (!bVar1) goto LAB_001b1fbc;
      generateReject(this,msg,10,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"",(allocator<char> *)&local_a0);
      generateLogout(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      generateReject(this,msg,1,origSendingTime.super_UtcTimeStampField.super_FieldBase.m_tag);
    }
    bVar3 = false;
  }
LAB_001b1fbc:
  FieldBase::~FieldBase((FieldBase *)&origSendingTime);
  return bVar3;
}

Assistant:

bool Session::doPossDup(const Message &msg) {
  OrigSendingTime origSendingTime = m_timestamper();

  const Header &header = msg.getHeader();
  auto const &msgType = header.getField<MsgType>();
  auto const &sendingTime = header.getField<SendingTime>();

  if (msgType != MsgType_SequenceReset) {
    if (!header.getFieldIfSet(origSendingTime)) {
      generateReject(msg, SessionRejectReason_REQUIRED_TAG_MISSING, origSendingTime.getTag());
      return false;
    }

    if (origSendingTime > sendingTime) {
      generateReject(msg, SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM);
      generateLogout();
      return false;
    }
  }
  return true;
}